

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O2

void deqp::gles2::Functional::eval_distance_vec4(ShaderEvalContext *c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [12];
  float fVar3;
  Vector<float,_4> local_28;
  Vector<float,_4> local_18;
  
  auVar1 = *(undefined1 (*) [16])c->in[0].m_data;
  auVar2 = auVar1._4_12_;
  local_18.m_data[3] = auVar1._0_4_;
  local_18.m_data[0] = (float)auVar2._0_4_;
  local_18.m_data[1] = (float)auVar2._4_4_;
  local_18.m_data[2] = (float)auVar2._8_4_;
  local_28.m_data[3] = c->in[1].m_data[0];
  local_28.m_data[2] = c->in[1].m_data[1];
  local_28.m_data[1] = c->in[1].m_data[2];
  local_28.m_data[0] = c->in[1].m_data[3];
  fVar3 = tcu::distance<float,4>(&local_18,&local_28);
  (c->color).m_data[0] = fVar3;
  return;
}

Assistant:

void eval_cross_vec3 (ShaderEvalContext& c) { c.color.xyz()	= cross(c.in[0].swizzle(2, 0, 1), c.in[1].swizzle(1, 2, 0)); }